

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_ict.cpp
# Opt level: O1

void __thiscall PrintICT::visit(PrintICT *this,Literal *node)

{
  Fragment *pFVar1;
  
  this->level = this->level + 1;
  printLexemeIR(this,"LITERAL_",node->literal);
  this->level = this->level - 1;
  pFVar1 = (node->super_Fragment).next;
  if (pFVar1 != (Fragment *)0x0) {
    (*pFVar1->_vptr_Fragment[2])(pFVar1,this);
    return;
  }
  return;
}

Assistant:

void PrintICT::visit(Literal *node) {
    up_level();
    printLexemeIR("LITERAL_", node->getLiteral());
    down_level();
    if (node->getNext()) node->getNext()->accept(this);
}